

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_GetVariableInt_Test::TestBody(AbstractTransaction_GetVariableInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  uint64_t value;
  allocator local_41;
  undefined1 local_40 [8];
  string test_data;
  TestTransaction tx;
  AbstractTransaction_GetVariableInt_Test *this_local;
  
  TestTransaction::TestTransaction((TestTransaction *)((long)&test_data.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"fe11111111",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_71 = TestTransaction::GetVariableIntTest
                       ((TestTransaction *)((long)&test_data.field_2 + 8),(string *)local_40,
                        (uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_70,
               (AssertionResult *)"tx.GetVariableIntTest(test_data, &value)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_bc = 0x11111111;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_b8,"value","286331153",(unsigned_long *)&gtest_ar_.message_,
             &local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::__cxx11::string::~string((string *)local_40);
  TestTransaction::~TestTransaction((TestTransaction *)((long)&test_data.field_2 + 8));
  return;
}

Assistant:

TEST(AbstractTransaction, GetVariableInt) {
  TestTransaction tx;
  std::string test_data = "fe11111111";
  uint64_t value = 0;
  EXPECT_TRUE(tx.GetVariableIntTest(test_data, &value));
  EXPECT_EQ(value, 286331153);
}